

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mars.cpp
# Opt level: O1

uint __thiscall MARS::makeMask(MARS *this,uint w)

{
  uint uVar1;
  
  uVar1 = w >> 1 ^ 0x7fffffff ^ w & 0x7fffffff;
  uVar1 = uVar1 >> 2 & uVar1 >> 1 & uVar1;
  uVar1 = uVar1 >> 6 & uVar1 >> 3 & uVar1;
  uVar1 = uVar1 << 2 | uVar1 * 2;
  uVar1 = uVar1 * 4 | uVar1;
  uVar1 = uVar1 << 4 | uVar1;
  uVar1 = uVar1 * 2 | uVar1;
  return ~(w * 2 ^ w >> 1) & (uVar1 >> 1 | uVar1) & 0x3ffffffe;
}

Assistant:

unsigned MARS::makeMask(unsigned w) {
    unsigned m = (~w ^ (w >> 1)) & 0x7fffffff;

    m &= (m >> 1) & (m >> 2);
    m &= (m >> 3) & (m >> 6);

    m <<= 1;
    m |= (m << 1);
    m |= (m << 2);
    m |= (m << 4);
    m |= (m << 1);
    m |= (m >> 1);


    m &= 0x3FFFFFFE;
    m &= ~((~(w << 1) ^ w) ^ (~(w >> 1) ^ w));

    return m;
}